

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
* __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>::
insert_unique<int>(pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
                   *__return_storage_ptr__,
                  btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                  *this,key_type *key,int *args)

{
  bool bVar1;
  node_type **ppnVar2;
  node_type *pnVar3;
  key_type *y;
  undefined8 extraout_RDX;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  bVar4;
  iterator iVar5;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  iter_00;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  iter_01;
  bool local_109;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *local_108;
  int local_100;
  undefined8 local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_e0;
  bool local_c9;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *local_c8;
  int local_c0;
  undefined1 local_a0 [8];
  iterator last;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_60;
  undefined1 (*local_50) [12];
  iterator *iter;
  undefined4 local_40;
  undefined1 auStack_38 [8];
  pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_int>
  res;
  int *args_local;
  key_type *key_local;
  btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *this_local;
  
  res._16_8_ = args;
  bVar1 = empty(this);
  if (bVar1) {
    pnVar3 = new_leaf_root_node(this,1);
    this->rightmost_ = pnVar3;
    ppnVar2 = mutable_root(this);
    *ppnVar2 = pnVar3;
  }
  pnVar3 = root(this);
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  ::btree_iterator((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                    *)&iter,pnVar3,0);
  bVar4._12_4_ = 0;
  bVar4.node = (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                *)iter;
  bVar4.position = local_40;
  btree<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>::
  internal_locate<int,gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>,int&,int*>>
            ((pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_int>
              *)auStack_38,
             (btree<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
              *)this,key,bVar4);
  local_50 = (undefined1 (*) [12])auStack_38;
  if (res.first.position == 0x40000000) {
    iter_00.node = (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                    *)((ulong)res.first.node & 0xffffffff);
    iter_00._8_8_ = extraout_RDX;
    bVar4 = btree<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
            ::
            internal_last<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>,int&,int*>>
                      ((btree<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                        *)auStack_38,iter_00);
    local_60.node = bVar4.node;
    local_60.position = bVar4.position;
    last._15_1_ = 0;
    std::
    make_pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>,int&,int*>,bool>
              (__return_storage_ptr__,&local_60,(bool *)&last.field_0xf);
  }
  else {
    if (res.first.position == 0) {
      iter_01.node = (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                      *)((ulong)res.first.node & 0xffffffff);
      iter_01._8_8_ = extraout_RDX;
      bVar4 = btree<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
              ::
              internal_last<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>,int&,int*>>
                        ((btree<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                          *)auStack_38,iter_01);
      local_c8 = bVar4.node;
      local_c0 = bVar4.position;
      local_a0 = (undefined1  [8])local_c8;
      last.node._0_4_ = local_c0;
      if (local_c8 !=
          (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
           *)0x0) {
        y = btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
            ::key((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                   *)local_a0);
        bVar1 = btree<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                ::compare_keys<int,int>
                          ((btree<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                            *)this,key,y);
        if (!bVar1) {
          local_c9 = false;
          std::
          make_pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>,int&,int*>&,bool>
                    (__return_storage_ptr__,
                     (btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                      *)local_a0,&local_c9);
          return __return_storage_ptr__;
        }
      }
    }
    local_f8 = *(undefined8 *)*local_50;
    uStack_f0 = (undefined4)*(undefined8 *)(*local_50 + 8);
    uStack_ec = (undefined4)((ulong)*(undefined8 *)(*local_50 + 8) >> 0x20);
    iVar5._12_4_ = 0;
    iVar5._0_12_ = *local_50;
    iVar5 = internal_emplace<int>(this,iVar5,(int *)res._16_8_);
    local_108 = iVar5.node;
    local_100 = iVar5.position;
    local_109 = true;
    local_e0.node = local_108;
    local_e0.position = local_100;
    std::
    make_pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>,int&,int*>,bool>
              (__return_storage_ptr__,&local_e0,&local_109);
  }
  return __return_storage_ptr__;
}

Assistant:

auto btree<P>::insert_unique(const key_type &key, Args &&... args)
    -> std::pair<iterator, bool> {
  if (empty()) {
    mutable_root() = rightmost_ = new_leaf_root_node(1);
  }

  std::pair<iterator, int> res = internal_locate(key, iterator(root(), 0));
  iterator &iter = res.first;
  if (res.second == kExactMatch) {
    // The key already exists in the tree, do nothing.
    return std::make_pair(internal_last(iter), false);
  } else if (!res.second) {
    iterator last = internal_last(iter);
    if (last.node && !compare_keys(key, last.key())) {
      // The key already exists in the tree, do nothing.
      return std::make_pair(last, false);
    }
  }

  return std::make_pair(internal_emplace(iter, std::forward<Args>(args)...),
                        true);
}